

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall BMP::~BMP(BMP *this)

{
  GreyCount *pGVar1;
  uchar **ppuVar2;
  Alphabet *pAVar3;
  long lVar4;
  int i;
  
  pAVar3 = this->alphabet;
  pGVar1 = pAVar3->symbol;
  if (pGVar1 != (GreyCount *)0x0) {
    lVar4 = *(long *)((long)&pGVar1[-1].codeHuffman.field_2 + 8);
    if (lVar4 != 0) {
      lVar4 = lVar4 << 7;
      do {
        bitMap::GreyCount::~GreyCount((GreyCount *)((long)&pGVar1[-1].num + lVar4));
        lVar4 = lVar4 + -0x80;
      } while (lVar4 != 0);
    }
    operator_delete__(&pGVar1[-1].codeHuffman.field_2);
    pAVar3 = this->alphabet;
    if (pAVar3 == (Alphabet *)0x0) goto LAB_00103254;
  }
  operator_delete__(pAVar3);
LAB_00103254:
  for (lVar4 = 0; ppuVar2 = this->field, lVar4 < (this->headInfo).biWidth; lVar4 = lVar4 + 1) {
    if (ppuVar2[lVar4] != (uchar *)0x0) {
      operator_delete__(ppuVar2[lVar4]);
    }
  }
  if (ppuVar2 != (uchar **)0x0) {
    operator_delete__(ppuVar2);
    return;
  }
  return;
}

Assistant:

BMP::~BMP()
{
    using namespace bitMap;

    delete[] alphabet->symbol;
    delete[] alphabet;

    for ( int i = 0; i < headInfo.biWidth; i++ ){
        delete[] field[ i ];
    }
    delete[] field;
}